

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_16777232,_true,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::TriangleMiMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float *pfVar1;
  undefined8 *puVar2;
  float *pfVar3;
  int iVar4;
  undefined4 uVar5;
  uint uVar6;
  uint uVar7;
  Scene *pSVar8;
  Geometry *pGVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  StackItemT<embree::NodeRefPtr<4>_> SVar13;
  StackItemT<embree::NodeRefPtr<4>_> SVar14;
  StackItemT<embree::NodeRefPtr<4>_> SVar15;
  float fVar16;
  float fVar17;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar18;
  undefined4 uVar19;
  AABBNodeMB4D *node1;
  ulong uVar20;
  RTCRayN *pRVar21;
  uint uVar22;
  long lVar23;
  ulong uVar24;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar25;
  ulong uVar26;
  long lVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  long lVar39;
  ulong uVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [64];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  float fVar58;
  float fVar68;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar69;
  float fVar81;
  float fVar82;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  float fVar83;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  float fVar84;
  float fVar85;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  float fVar98;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar109;
  float fVar111;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  float fVar113;
  undefined1 auVar106 [16];
  float fVar110;
  float fVar112;
  float fVar114;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar115;
  float fVar121;
  float fVar122;
  undefined1 auVar116 [16];
  float fVar123;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [64];
  float fVar133;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  float fVar145;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  float fVar143;
  float fVar144;
  undefined1 auVar142 [64];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [64];
  float fVar151;
  float fVar156;
  undefined1 auVar152 [16];
  float fVar154;
  float fVar155;
  undefined1 auVar153 [64];
  undefined1 auVar157 [16];
  undefined1 auVar158 [64];
  float fVar159;
  float fVar164;
  undefined1 auVar160 [16];
  float fVar162;
  float fVar163;
  float fVar165;
  undefined1 auVar161 [64];
  float fVar166;
  float fVar167;
  undefined1 auVar168 [16];
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  undefined1 auVar169 [64];
  float fVar176;
  undefined1 auVar177 [16];
  float fVar182;
  undefined1 auVar178 [16];
  float fVar180;
  float fVar181;
  undefined1 auVar179 [64];
  float fVar183;
  undefined1 auVar184 [16];
  float fVar186;
  float fVar187;
  float fVar188;
  undefined1 auVar185 [64];
  UVIdentity<4> mapUV;
  undefined1 local_12e8 [8];
  float fStack_12e0;
  float fStack_12dc;
  Scene *scene;
  float local_12a8;
  float fStack_12a4;
  float fStack_12a0;
  float fStack_129c;
  float local_1298;
  float fStack_1294;
  float fStack_1290;
  float fStack_128c;
  float local_1288;
  float fStack_1284;
  float fStack_1280;
  float fStack_127c;
  vbool<4> valid;
  float local_1258;
  float fStack_1254;
  float fStack_1250;
  float fStack_124c;
  float local_1238;
  float fStack_1234;
  float fStack_1230;
  float fStack_122c;
  undefined1 local_1228 [16];
  undefined1 (*local_1218) [16];
  ulong local_1210;
  long local_1208;
  long local_1200;
  RTCFilterFunctionNArguments args;
  undefined8 local_11b8;
  undefined8 uStack_11b0;
  vfloat<4> tNear;
  undefined1 local_1158 [16];
  undefined1 local_1148 [16];
  undefined1 local_1138 [16];
  undefined1 local_1128 [16];
  undefined1 local_1118 [16];
  undefined1 local_1108 [16];
  undefined1 local_10f8 [16];
  undefined1 local_10e8 [16];
  undefined1 local_10d8 [16];
  undefined1 local_10c8 [16];
  undefined1 local_10b8 [16];
  undefined1 local_10a8 [16];
  undefined1 local_1098 [16];
  undefined1 local_1088 [16];
  undefined1 local_1078 [16];
  undefined1 local_1068 [16];
  undefined1 local_1058 [16];
  undefined1 local_1048 [16];
  undefined1 local_1038 [16];
  undefined1 local_1028 [16];
  undefined8 local_1018;
  undefined8 uStack_1010;
  RTCHitN local_1008 [16];
  undefined1 local_ff8 [16];
  undefined1 local_fe8 [16];
  undefined1 local_fd8 [16];
  undefined4 local_fc8;
  undefined4 uStack_fc4;
  undefined4 uStack_fc0;
  undefined4 uStack_fbc;
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  uint local_f98;
  uint uStack_f94;
  uint uStack_f90;
  uint uStack_f8c;
  uint uStack_f88;
  uint uStack_f84;
  uint uStack_f80;
  uint uStack_f7c;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  
  pSVar25 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  uVar19 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_1078._4_4_ = uVar19;
  local_1078._0_4_ = uVar19;
  local_1078._8_4_ = uVar19;
  local_1078._12_4_ = uVar19;
  auVar132 = ZEXT1664(local_1078);
  uVar19 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_1088._4_4_ = uVar19;
  local_1088._0_4_ = uVar19;
  local_1088._8_4_ = uVar19;
  local_1088._12_4_ = uVar19;
  auVar142 = ZEXT1664(local_1088);
  uVar19 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_1098._4_4_ = uVar19;
  local_1098._0_4_ = uVar19;
  local_1098._8_4_ = uVar19;
  local_1098._12_4_ = uVar19;
  auVar150 = ZEXT1664(local_1098);
  fVar84 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar94 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar96 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar41 = ZEXT416((uint)(fVar84 * 0.99999964));
  local_10a8 = vshufps_avx(auVar41,auVar41,0);
  auVar153 = ZEXT1664(local_10a8);
  auVar41 = ZEXT416((uint)(fVar94 * 0.99999964));
  local_10b8 = vshufps_avx(auVar41,auVar41,0);
  auVar158 = ZEXT1664(local_10b8);
  auVar41 = ZEXT416((uint)(fVar96 * 0.99999964));
  local_10c8 = vshufps_avx(auVar41,auVar41,0);
  auVar161 = ZEXT1664(local_10c8);
  auVar41 = ZEXT416((uint)(fVar84 * 1.0000004));
  local_10d8 = vshufps_avx(auVar41,auVar41,0);
  auVar169 = ZEXT1664(local_10d8);
  auVar41 = ZEXT416((uint)(fVar94 * 1.0000004));
  local_10e8 = vshufps_avx(auVar41,auVar41,0);
  auVar179 = ZEXT1664(local_10e8);
  auVar41 = ZEXT416((uint)(fVar96 * 1.0000004));
  local_10f8 = vshufps_avx(auVar41,auVar41,0);
  auVar185 = ZEXT1664(local_10f8);
  uVar32 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar38 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar37 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar40 = uVar38 ^ 0x10;
  iVar4 = (tray->tnear).field_0.i[k];
  auVar41._4_4_ = iVar4;
  auVar41._0_4_ = iVar4;
  auVar41._8_4_ = iVar4;
  auVar41._12_4_ = iVar4;
  iVar4 = (tray->tfar).field_0.i[k];
  auVar47 = ZEXT1664(CONCAT412(iVar4,CONCAT48(iVar4,CONCAT44(iVar4,iVar4))));
  local_1218 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_1210 = uVar38;
LAB_00eee92d:
  do {
    do {
      if (pSVar25 == stack) {
        return;
      }
      pSVar18 = pSVar25 + -1;
      pSVar25 = pSVar25 + -1;
    } while (*(float *)(ray + k * 4 + 0x80) < (float)pSVar18->dist);
    uVar24 = (pSVar25->ptr).ptr;
    while ((uVar24 & 8) == 0) {
      uVar20 = uVar24 & 0xfffffffffffffff0;
      fVar84 = *(float *)(ray + k * 4 + 0x70);
      auVar48._4_4_ = fVar84;
      auVar48._0_4_ = fVar84;
      auVar48._8_4_ = fVar84;
      auVar48._12_4_ = fVar84;
      pfVar3 = (float *)(uVar20 + 0x80 + uVar32);
      pfVar1 = (float *)(uVar20 + 0x20 + uVar32);
      auVar49._0_4_ = fVar84 * *pfVar3 + *pfVar1;
      auVar49._4_4_ = fVar84 * pfVar3[1] + pfVar1[1];
      auVar49._8_4_ = fVar84 * pfVar3[2] + pfVar1[2];
      auVar49._12_4_ = fVar84 * pfVar3[3] + pfVar1[3];
      auVar49 = vsubps_avx(auVar49,auVar132._0_16_);
      auVar59._0_4_ = auVar153._0_4_ * auVar49._0_4_;
      auVar59._4_4_ = auVar153._4_4_ * auVar49._4_4_;
      auVar59._8_4_ = auVar153._8_4_ * auVar49._8_4_;
      auVar59._12_4_ = auVar153._12_4_ * auVar49._12_4_;
      pfVar3 = (float *)(uVar20 + 0x80 + uVar38);
      auVar49 = vmaxps_avx(auVar41,auVar59);
      pfVar1 = (float *)(uVar20 + 0x20 + uVar38);
      auVar70._0_4_ = fVar84 * *pfVar3 + *pfVar1;
      auVar70._4_4_ = fVar84 * pfVar3[1] + pfVar1[1];
      auVar70._8_4_ = fVar84 * pfVar3[2] + pfVar1[2];
      auVar70._12_4_ = fVar84 * pfVar3[3] + pfVar1[3];
      auVar59 = vsubps_avx(auVar70,auVar142._0_16_);
      pfVar3 = (float *)(uVar20 + 0x80 + uVar37);
      pfVar1 = (float *)(uVar20 + 0x20 + uVar37);
      auVar86._0_4_ = fVar84 * *pfVar3 + *pfVar1;
      auVar86._4_4_ = fVar84 * pfVar3[1] + pfVar1[1];
      auVar86._8_4_ = fVar84 * pfVar3[2] + pfVar1[2];
      auVar86._12_4_ = fVar84 * pfVar3[3] + pfVar1[3];
      auVar71._0_4_ = auVar158._0_4_ * auVar59._0_4_;
      auVar71._4_4_ = auVar158._4_4_ * auVar59._4_4_;
      auVar71._8_4_ = auVar158._8_4_ * auVar59._8_4_;
      auVar71._12_4_ = auVar158._12_4_ * auVar59._12_4_;
      auVar59 = vsubps_avx(auVar86,auVar150._0_16_);
      auVar87._0_4_ = auVar161._0_4_ * auVar59._0_4_;
      auVar87._4_4_ = auVar161._4_4_ * auVar59._4_4_;
      auVar87._8_4_ = auVar161._8_4_ * auVar59._8_4_;
      auVar87._12_4_ = auVar161._12_4_ * auVar59._12_4_;
      auVar59 = vmaxps_avx(auVar71,auVar87);
      pfVar3 = (float *)(uVar20 + 0x80 + (uVar32 ^ 0x10));
      pfVar1 = (float *)(uVar20 + 0x20 + (uVar32 ^ 0x10));
      auVar88._0_4_ = fVar84 * *pfVar3 + *pfVar1;
      auVar88._4_4_ = fVar84 * pfVar3[1] + pfVar1[1];
      auVar88._8_4_ = fVar84 * pfVar3[2] + pfVar1[2];
      auVar88._12_4_ = fVar84 * pfVar3[3] + pfVar1[3];
      tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vmaxps_avx(auVar49,auVar59);
      auVar49 = vsubps_avx(auVar88,auVar132._0_16_);
      auVar72._0_4_ = auVar169._0_4_ * auVar49._0_4_;
      auVar72._4_4_ = auVar169._4_4_ * auVar49._4_4_;
      auVar72._8_4_ = auVar169._8_4_ * auVar49._8_4_;
      auVar72._12_4_ = auVar169._12_4_ * auVar49._12_4_;
      auVar49 = vminps_avx(auVar47._0_16_,auVar72);
      pfVar3 = (float *)(uVar20 + 0x80 + uVar40);
      pfVar1 = (float *)(uVar20 + 0x20 + uVar40);
      auVar89._0_4_ = fVar84 * *pfVar3 + *pfVar1;
      auVar89._4_4_ = fVar84 * pfVar3[1] + pfVar1[1];
      auVar89._8_4_ = fVar84 * pfVar3[2] + pfVar1[2];
      auVar89._12_4_ = fVar84 * pfVar3[3] + pfVar1[3];
      auVar59 = vsubps_avx(auVar89,auVar142._0_16_);
      auVar90._0_4_ = auVar179._0_4_ * auVar59._0_4_;
      auVar90._4_4_ = auVar179._4_4_ * auVar59._4_4_;
      auVar90._8_4_ = auVar179._8_4_ * auVar59._8_4_;
      auVar90._12_4_ = auVar179._12_4_ * auVar59._12_4_;
      pfVar3 = (float *)(uVar20 + 0x80 + (uVar37 ^ 0x10));
      pfVar1 = (float *)(uVar20 + 0x20 + (uVar37 ^ 0x10));
      auVar102._0_4_ = fVar84 * *pfVar3 + *pfVar1;
      auVar102._4_4_ = fVar84 * pfVar3[1] + pfVar1[1];
      auVar102._8_4_ = fVar84 * pfVar3[2] + pfVar1[2];
      auVar102._12_4_ = fVar84 * pfVar3[3] + pfVar1[3];
      auVar59 = vsubps_avx(auVar102,auVar150._0_16_);
      auVar103._0_4_ = auVar185._0_4_ * auVar59._0_4_;
      auVar103._4_4_ = auVar185._4_4_ * auVar59._4_4_;
      auVar103._8_4_ = auVar185._8_4_ * auVar59._8_4_;
      auVar103._12_4_ = auVar185._12_4_ * auVar59._12_4_;
      auVar59 = vminps_avx(auVar90,auVar103);
      auVar49 = vminps_avx(auVar49,auVar59);
      if (((uint)uVar24 & 7) == 6) {
        auVar59 = vcmpps_avx((undefined1  [16])tNear.field_0,auVar49,2);
        auVar49 = vcmpps_avx(*(undefined1 (*) [16])(uVar20 + 0xe0),auVar48,2);
        auVar48 = vcmpps_avx(auVar48,*(undefined1 (*) [16])(uVar20 + 0xf0),1);
        auVar49 = vandps_avx(auVar49,auVar48);
        auVar49 = vandps_avx(auVar49,auVar59);
      }
      else {
        auVar49 = vcmpps_avx((undefined1  [16])tNear.field_0,auVar49,2);
      }
      auVar49 = vpslld_avx(auVar49,0x1f);
      uVar22 = vmovmskps_avx(auVar49);
      if (uVar22 == 0) goto LAB_00eee92d;
      uVar22 = uVar22 & 0xff;
      lVar27 = 0;
      if (uVar22 != 0) {
        for (; (uVar22 >> lVar27 & 1) == 0; lVar27 = lVar27 + 1) {
        }
      }
      uVar24 = *(ulong *)(uVar20 + lVar27 * 8);
      uVar22 = uVar22 - 1 & uVar22;
      if (uVar22 != 0) {
        uVar6 = tNear.field_0.i[lVar27];
        lVar27 = 0;
        if (uVar22 != 0) {
          for (; (uVar22 >> lVar27 & 1) == 0; lVar27 = lVar27 + 1) {
          }
        }
        uVar26 = *(ulong *)(uVar20 + lVar27 * 8);
        uVar7 = tNear.field_0.i[lVar27];
        uVar22 = uVar22 - 1 & uVar22;
        if (uVar22 == 0) {
          if (uVar6 < uVar7) {
            (pSVar25->ptr).ptr = uVar26;
            pSVar25->dist = uVar7;
            pSVar25 = pSVar25 + 1;
          }
          else {
            (pSVar25->ptr).ptr = uVar24;
            pSVar25->dist = uVar6;
            uVar24 = uVar26;
            pSVar25 = pSVar25 + 1;
          }
        }
        else {
          auVar50._8_8_ = 0;
          auVar50._0_8_ = uVar24;
          auVar49 = vpunpcklqdq_avx(auVar50,ZEXT416(uVar6));
          auVar60._8_8_ = 0;
          auVar60._0_8_ = uVar26;
          auVar59 = vpunpcklqdq_avx(auVar60,ZEXT416(uVar7));
          lVar27 = 0;
          if (uVar22 != 0) {
            for (; (uVar22 >> lVar27 & 1) == 0; lVar27 = lVar27 + 1) {
            }
          }
          auVar73._8_8_ = 0;
          auVar73._0_8_ = *(ulong *)(uVar20 + lVar27 * 8);
          auVar70 = vpunpcklqdq_avx(auVar73,ZEXT416((uint)tNear.field_0.i[lVar27]));
          auVar48 = vpcmpgtd_avx(auVar59,auVar49);
          uVar22 = uVar22 - 1 & uVar22;
          if (uVar22 == 0) {
            auVar71 = vpshufd_avx(auVar48,0xaa);
            auVar48 = vblendvps_avx(auVar59,auVar49,auVar71);
            auVar49 = vblendvps_avx(auVar49,auVar59,auVar71);
            auVar59 = vpcmpgtd_avx(auVar70,auVar48);
            auVar71 = vpshufd_avx(auVar59,0xaa);
            auVar59 = vblendvps_avx(auVar70,auVar48,auVar71);
            auVar48 = vblendvps_avx(auVar48,auVar70,auVar71);
            auVar70 = vpcmpgtd_avx(auVar48,auVar49);
            auVar70 = vpshufd_avx(auVar70,0xaa);
            SVar13 = (StackItemT<embree::NodeRefPtr<4>_>)vblendvps_avx(auVar48,auVar49,auVar70);
            SVar14 = (StackItemT<embree::NodeRefPtr<4>_>)vblendvps_avx(auVar49,auVar48,auVar70);
            *pSVar25 = SVar14;
            pSVar25[1] = SVar13;
            uVar24 = auVar59._0_8_;
            pSVar25 = pSVar25 + 2;
          }
          else {
            lVar27 = 0;
            if (uVar22 != 0) {
              for (; (uVar22 >> lVar27 & 1) == 0; lVar27 = lVar27 + 1) {
              }
            }
            auVar104._8_8_ = 0;
            auVar104._0_8_ = *(ulong *)(uVar20 + lVar27 * 8);
            auVar72 = vpunpcklqdq_avx(auVar104,ZEXT416((uint)tNear.field_0.i[lVar27]));
            auVar71 = vpshufd_avx(auVar48,0xaa);
            auVar48 = vblendvps_avx(auVar59,auVar49,auVar71);
            auVar49 = vblendvps_avx(auVar49,auVar59,auVar71);
            auVar59 = vpcmpgtd_avx(auVar72,auVar70);
            auVar71 = vpshufd_avx(auVar59,0xaa);
            auVar59 = vblendvps_avx(auVar72,auVar70,auVar71);
            auVar70 = vblendvps_avx(auVar70,auVar72,auVar71);
            auVar71 = vpcmpgtd_avx(auVar70,auVar49);
            auVar72 = vpshufd_avx(auVar71,0xaa);
            auVar71 = vblendvps_avx(auVar70,auVar49,auVar72);
            SVar13 = (StackItemT<embree::NodeRefPtr<4>_>)vblendvps_avx(auVar49,auVar70,auVar72);
            auVar49 = vpcmpgtd_avx(auVar59,auVar48);
            auVar70 = vpshufd_avx(auVar49,0xaa);
            auVar49 = vblendvps_avx(auVar59,auVar48,auVar70);
            auVar59 = vblendvps_avx(auVar48,auVar59,auVar70);
            auVar48 = vpcmpgtd_avx(auVar71,auVar59);
            auVar48 = vpshufd_avx(auVar48,0xaa);
            SVar14 = (StackItemT<embree::NodeRefPtr<4>_>)vblendvps_avx(auVar71,auVar59,auVar48);
            SVar15 = (StackItemT<embree::NodeRefPtr<4>_>)vblendvps_avx(auVar59,auVar71,auVar48);
            *pSVar25 = SVar13;
            pSVar25[1] = SVar15;
            pSVar25[2] = SVar14;
            uVar24 = auVar49._0_8_;
            pSVar25 = pSVar25 + 3;
          }
        }
      }
    }
    local_1208 = (ulong)((uint)uVar24 & 0xf) - 8;
    uVar24 = uVar24 & 0xfffffffffffffff0;
    for (local_1200 = 0; local_1200 != local_1208; local_1200 = local_1200 + 1) {
      lVar39 = local_1200 * 0x50;
      pSVar8 = context->scene;
      pGVar9 = (pSVar8->geometries).items[*(uint *)(uVar24 + 0x30 + lVar39)].ptr;
      fVar84 = (pGVar9->time_range).lower;
      fVar84 = pGVar9->fnumTimeSegments *
               ((*(float *)(ray + k * 4 + 0x70) - fVar84) / ((pGVar9->time_range).upper - fVar84));
      auVar49 = vroundss_avx(ZEXT416((uint)fVar84),ZEXT416((uint)fVar84),9);
      auVar49 = vminss_avx(auVar49,ZEXT416((uint)(pGVar9->fnumTimeSegments + -1.0)));
      auVar103 = vmaxss_avx(ZEXT816(0),auVar49);
      lVar23 = (long)(int)auVar103._0_4_ * 0x38;
      uVar35 = (ulong)*(uint *)(uVar24 + 4 + lVar39);
      lVar27 = *(long *)(*(long *)&pGVar9[2].numPrimitives + lVar23);
      lVar23 = *(long *)(*(long *)&pGVar9[2].numPrimitives + 0x38 + lVar23);
      auVar49 = *(undefined1 (*) [16])(lVar27 + (ulong)*(uint *)(uVar24 + lVar39) * 4);
      uVar26 = (ulong)*(uint *)(uVar24 + 0x10 + lVar39);
      auVar59 = *(undefined1 (*) [16])(lVar27 + uVar26 * 4);
      uVar28 = (ulong)*(uint *)(uVar24 + 0x20 + lVar39);
      auVar104 = *(undefined1 (*) [16])(lVar27 + uVar28 * 4);
      auVar48 = *(undefined1 (*) [16])(lVar27 + uVar35 * 4);
      uVar29 = (ulong)*(uint *)(uVar24 + 0x14 + lVar39);
      auVar70 = *(undefined1 (*) [16])(lVar27 + uVar29 * 4);
      uVar30 = (ulong)*(uint *)(uVar24 + 0x24 + lVar39);
      auVar61 = *(undefined1 (*) [16])(lVar27 + uVar30 * 4);
      uVar31 = (ulong)*(uint *)(uVar24 + 8 + lVar39);
      auVar71 = *(undefined1 (*) [16])(lVar27 + uVar31 * 4);
      uVar38 = (ulong)*(uint *)(uVar24 + 0x18 + lVar39);
      auVar72 = *(undefined1 (*) [16])(lVar27 + uVar38 * 4);
      uVar33 = (ulong)*(uint *)(uVar24 + 0x28 + lVar39);
      auVar86 = *(undefined1 (*) [16])(lVar27 + uVar33 * 4);
      uVar34 = (ulong)*(uint *)(uVar24 + 0xc + lVar39);
      auVar87 = *(undefined1 (*) [16])(lVar27 + uVar34 * 4);
      uVar36 = (ulong)*(uint *)(uVar24 + 0x1c + lVar39);
      auVar88 = *(undefined1 (*) [16])(lVar27 + uVar36 * 4);
      uVar20 = (ulong)*(uint *)(uVar24 + 0x2c + lVar39);
      auVar89 = *(undefined1 (*) [16])(lVar27 + uVar20 * 4);
      auVar90 = *(undefined1 (*) [16])(lVar23 + (ulong)*(uint *)(uVar24 + lVar39) * 4);
      auVar102 = *(undefined1 (*) [16])(lVar23 + uVar26 * 4);
      fVar84 = fVar84 - auVar103._0_4_;
      auVar103 = vunpcklps_avx(auVar49,auVar71);
      auVar71 = vunpckhps_avx(auVar49,auVar71);
      auVar50 = vunpcklps_avx(auVar48,auVar87);
      auVar48 = vunpckhps_avx(auVar48,auVar87);
      auVar49 = *(undefined1 (*) [16])(lVar23 + uVar35 * 4);
      auVar60 = vunpcklps_avx(auVar71,auVar48);
      auVar73 = vunpcklps_avx(auVar103,auVar50);
      auVar71 = vunpckhps_avx(auVar103,auVar50);
      auVar87 = vunpcklps_avx(auVar59,auVar72);
      auVar48 = vunpckhps_avx(auVar59,auVar72);
      auVar72 = vunpcklps_avx(auVar70,auVar88);
      auVar70 = vunpckhps_avx(auVar70,auVar88);
      auVar59 = *(undefined1 (*) [16])(lVar23 + uVar31 * 4);
      auVar88 = vunpcklps_avx(auVar48,auVar70);
      auVar103 = vunpcklps_avx(auVar87,auVar72);
      auVar70 = vunpckhps_avx(auVar87,auVar72);
      auVar87 = vunpcklps_avx(auVar104,auVar86);
      auVar72 = vunpckhps_avx(auVar104,auVar86);
      auVar50 = vunpcklps_avx(auVar61,auVar89);
      auVar86 = vunpckhps_avx(auVar61,auVar89);
      auVar48 = *(undefined1 (*) [16])(lVar23 + uVar34 * 4);
      auVar89 = vunpcklps_avx(auVar72,auVar86);
      auVar104 = vunpcklps_avx(auVar87,auVar50);
      auVar72 = vunpckhps_avx(auVar87,auVar50);
      auVar86 = vunpcklps_avx(auVar90,auVar59);
      auVar59 = vunpckhps_avx(auVar90,auVar59);
      auVar87 = vunpcklps_avx(auVar49,auVar48);
      auVar48 = vunpckhps_avx(auVar49,auVar48);
      auVar49 = *(undefined1 (*) [16])(lVar23 + uVar38 * 4);
      auVar90 = vunpcklps_avx(auVar59,auVar48);
      auVar50 = vunpcklps_avx(auVar86,auVar87);
      auVar48 = vunpckhps_avx(auVar86,auVar87);
      auVar87 = vunpcklps_avx(auVar102,auVar49);
      auVar86 = vunpckhps_avx(auVar102,auVar49);
      auVar49 = *(undefined1 (*) [16])(lVar23 + uVar29 * 4);
      auVar59 = *(undefined1 (*) [16])(lVar23 + uVar36 * 4);
      auVar102 = vunpcklps_avx(auVar49,auVar59);
      auVar49 = vunpckhps_avx(auVar49,auVar59);
      auVar61 = vunpcklps_avx(auVar86,auVar49);
      auVar51 = vunpcklps_avx(auVar87,auVar102);
      auVar86 = vunpckhps_avx(auVar87,auVar102);
      auVar49 = *(undefined1 (*) [16])(lVar23 + uVar28 * 4);
      auVar59 = *(undefined1 (*) [16])(lVar23 + uVar33 * 4);
      auVar102 = vunpcklps_avx(auVar49,auVar59);
      auVar87 = vunpckhps_avx(auVar49,auVar59);
      auVar49 = *(undefined1 (*) [16])(lVar23 + uVar30 * 4);
      auVar59 = *(undefined1 (*) [16])(lVar23 + uVar20 * 4);
      auVar62 = vunpcklps_avx(auVar49,auVar59);
      auVar49 = vunpckhps_avx(auVar49,auVar59);
      auVar63 = vunpcklps_avx(auVar87,auVar49);
      auVar74 = vunpcklps_avx(auVar102,auVar62);
      auVar87 = vunpckhps_avx(auVar102,auVar62);
      auVar49 = vshufps_avx(ZEXT416((uint)fVar84),ZEXT416((uint)fVar84),0);
      auVar59 = vshufps_avx(ZEXT416((uint)(1.0 - fVar84)),ZEXT416((uint)(1.0 - fVar84)),0);
      fVar69 = auVar49._0_4_;
      fVar81 = auVar49._4_4_;
      fVar82 = auVar49._8_4_;
      fVar83 = auVar49._12_4_;
      fVar84 = auVar59._0_4_;
      fVar94 = auVar59._4_4_;
      fVar96 = auVar59._8_4_;
      fVar164 = auVar59._12_4_;
      auVar116._0_4_ = fVar84 * auVar73._0_4_ + fVar69 * auVar50._0_4_;
      auVar116._4_4_ = fVar94 * auVar73._4_4_ + fVar81 * auVar50._4_4_;
      auVar116._8_4_ = fVar96 * auVar73._8_4_ + fVar82 * auVar50._8_4_;
      auVar116._12_4_ = fVar164 * auVar73._12_4_ + fVar83 * auVar50._12_4_;
      auVar124._0_4_ = fVar84 * auVar71._0_4_ + fVar69 * auVar48._0_4_;
      auVar124._4_4_ = fVar94 * auVar71._4_4_ + fVar81 * auVar48._4_4_;
      auVar124._8_4_ = fVar96 * auVar71._8_4_ + fVar82 * auVar48._8_4_;
      auVar124._12_4_ = fVar164 * auVar71._12_4_ + fVar83 * auVar48._12_4_;
      local_1258 = auVar60._0_4_;
      fStack_1254 = auVar60._4_4_;
      fStack_1250 = auVar60._8_4_;
      fStack_124c = auVar60._12_4_;
      auVar91._0_4_ = fVar84 * local_1258 + fVar69 * auVar90._0_4_;
      auVar91._4_4_ = fVar94 * fStack_1254 + fVar81 * auVar90._4_4_;
      auVar91._8_4_ = fVar96 * fStack_1250 + fVar82 * auVar90._8_4_;
      auVar91._12_4_ = fVar164 * fStack_124c + fVar83 * auVar90._12_4_;
      auVar134._0_4_ = fVar84 * auVar103._0_4_ + fVar69 * auVar51._0_4_;
      auVar134._4_4_ = fVar94 * auVar103._4_4_ + fVar81 * auVar51._4_4_;
      auVar134._8_4_ = fVar96 * auVar103._8_4_ + fVar82 * auVar51._8_4_;
      auVar134._12_4_ = fVar164 * auVar103._12_4_ + fVar83 * auVar51._12_4_;
      auVar105._0_4_ = fVar84 * auVar70._0_4_ + fVar69 * auVar86._0_4_;
      auVar105._4_4_ = fVar94 * auVar70._4_4_ + fVar81 * auVar86._4_4_;
      auVar105._8_4_ = fVar96 * auVar70._8_4_ + fVar82 * auVar86._8_4_;
      auVar105._12_4_ = fVar164 * auVar70._12_4_ + fVar83 * auVar86._12_4_;
      puVar2 = (undefined8 *)(uVar24 + 0x30 + lVar39);
      local_1018 = *puVar2;
      uStack_1010 = puVar2[1];
      puVar2 = (undefined8 *)(uVar24 + 0x40 + lVar39);
      local_1288 = auVar88._0_4_;
      fStack_1284 = auVar88._4_4_;
      fStack_1280 = auVar88._8_4_;
      fStack_127c = auVar88._12_4_;
      auVar51._0_4_ = fVar84 * local_1288 + fVar69 * auVar61._0_4_;
      auVar51._4_4_ = fVar94 * fStack_1284 + fVar81 * auVar61._4_4_;
      auVar51._8_4_ = fVar96 * fStack_1280 + fVar82 * auVar61._8_4_;
      auVar51._12_4_ = fVar164 * fStack_127c + fVar83 * auVar61._12_4_;
      local_1238 = auVar104._0_4_;
      fStack_1234 = auVar104._4_4_;
      fStack_1230 = auVar104._8_4_;
      fStack_122c = auVar104._12_4_;
      auVar61._0_4_ = fVar84 * local_1238 + fVar69 * auVar74._0_4_;
      auVar61._4_4_ = fVar94 * fStack_1234 + fVar81 * auVar74._4_4_;
      auVar61._8_4_ = fVar96 * fStack_1230 + fVar82 * auVar74._8_4_;
      auVar61._12_4_ = fVar164 * fStack_122c + fVar83 * auVar74._12_4_;
      local_12a8 = auVar72._0_4_;
      fStack_12a4 = auVar72._4_4_;
      fStack_12a0 = auVar72._8_4_;
      fStack_129c = auVar72._12_4_;
      auVar184._0_4_ = fVar84 * local_12a8 + fVar69 * auVar87._0_4_;
      auVar184._4_4_ = fVar94 * fStack_12a4 + fVar81 * auVar87._4_4_;
      auVar184._8_4_ = fVar96 * fStack_12a0 + fVar82 * auVar87._8_4_;
      auVar184._12_4_ = fVar164 * fStack_129c + fVar83 * auVar87._12_4_;
      local_1298 = auVar89._0_4_;
      fStack_1294 = auVar89._4_4_;
      fStack_1290 = auVar89._8_4_;
      fStack_128c = auVar89._12_4_;
      auVar146._0_4_ = fVar69 * auVar63._0_4_ + fVar84 * local_1298;
      auVar146._4_4_ = fVar81 * auVar63._4_4_ + fVar94 * fStack_1294;
      auVar146._8_4_ = fVar82 * auVar63._8_4_ + fVar96 * fStack_1290;
      auVar146._12_4_ = fVar83 * auVar63._12_4_ + fVar164 * fStack_128c;
      local_11b8 = *puVar2;
      uStack_11b0 = puVar2[1];
      uVar19 = *(undefined4 *)(ray + k * 4);
      auVar160._4_4_ = uVar19;
      auVar160._0_4_ = uVar19;
      auVar160._8_4_ = uVar19;
      auVar160._12_4_ = uVar19;
      uVar19 = *(undefined4 *)(ray + k * 4 + 0x10);
      auVar168._4_4_ = uVar19;
      auVar168._0_4_ = uVar19;
      auVar168._8_4_ = uVar19;
      auVar168._12_4_ = uVar19;
      uVar19 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar177._4_4_ = uVar19;
      auVar177._0_4_ = uVar19;
      auVar177._8_4_ = uVar19;
      auVar177._12_4_ = uVar19;
      auVar49 = vsubps_avx(auVar116,auVar160);
      auVar59 = vsubps_avx(auVar124,auVar168);
      auVar48 = vsubps_avx(auVar91,auVar177);
      auVar70 = vsubps_avx(auVar134,auVar160);
      auVar71 = vsubps_avx(auVar105,auVar168);
      auVar72 = vsubps_avx(auVar51,auVar177);
      auVar86 = vsubps_avx(auVar61,auVar160);
      auVar87 = vsubps_avx(auVar184,auVar168);
      auVar88 = vsubps_avx(auVar146,auVar177);
      auVar89 = vsubps_avx(auVar86,auVar49);
      auVar90 = vsubps_avx(auVar87,auVar59);
      local_1028 = vsubps_avx(auVar88,auVar48);
      fVar164 = auVar59._0_4_;
      fVar84 = auVar87._0_4_ + fVar164;
      fVar81 = auVar59._4_4_;
      fVar94 = auVar87._4_4_ + fVar81;
      fVar83 = auVar59._8_4_;
      fVar96 = auVar87._8_4_ + fVar83;
      fVar11 = auVar59._12_4_;
      fVar98 = auVar87._12_4_ + fVar11;
      fVar69 = auVar48._0_4_;
      fVar100 = auVar88._0_4_ + fVar69;
      fVar82 = auVar48._4_4_;
      fVar109 = auVar88._4_4_ + fVar82;
      fVar10 = auVar48._8_4_;
      fVar111 = auVar88._8_4_ + fVar10;
      fVar12 = auVar48._12_4_;
      fVar113 = auVar88._12_4_ + fVar12;
      fVar58 = local_1028._0_4_;
      auVar135._0_4_ = fVar84 * fVar58;
      fVar68 = local_1028._4_4_;
      auVar135._4_4_ = fVar94 * fVar68;
      fVar16 = local_1028._8_4_;
      auVar135._8_4_ = fVar96 * fVar16;
      fVar17 = local_1028._12_4_;
      auVar135._12_4_ = fVar98 * fVar17;
      fVar183 = auVar90._0_4_;
      auVar147._0_4_ = fVar183 * fVar100;
      fVar186 = auVar90._4_4_;
      auVar147._4_4_ = fVar186 * fVar109;
      fVar187 = auVar90._8_4_;
      auVar147._8_4_ = fVar187 * fVar111;
      fVar188 = auVar90._12_4_;
      auVar147._12_4_ = fVar188 * fVar113;
      auVar90 = vsubps_avx(auVar147,auVar135);
      fVar151 = auVar49._0_4_;
      fVar133 = fVar151 + auVar86._0_4_;
      fVar154 = auVar49._4_4_;
      fVar143 = fVar154 + auVar86._4_4_;
      fVar155 = auVar49._8_4_;
      fVar144 = fVar155 + auVar86._8_4_;
      fVar156 = auVar49._12_4_;
      fVar145 = fVar156 + auVar86._12_4_;
      fVar176 = auVar89._0_4_;
      auVar106._0_4_ = fVar176 * fVar100;
      fVar180 = auVar89._4_4_;
      auVar106._4_4_ = fVar180 * fVar109;
      fVar181 = auVar89._8_4_;
      auVar106._8_4_ = fVar181 * fVar111;
      fVar182 = auVar89._12_4_;
      auVar106._12_4_ = fVar182 * fVar113;
      auVar148._0_4_ = fVar133 * fVar58;
      auVar148._4_4_ = fVar143 * fVar68;
      auVar148._8_4_ = fVar144 * fVar16;
      auVar148._12_4_ = fVar145 * fVar17;
      auVar89 = vsubps_avx(auVar148,auVar106);
      auVar136._0_4_ = fVar133 * fVar183;
      auVar136._4_4_ = fVar143 * fVar186;
      auVar136._8_4_ = fVar144 * fVar187;
      auVar136._12_4_ = fVar145 * fVar188;
      auVar92._0_4_ = fVar176 * fVar84;
      auVar92._4_4_ = fVar180 * fVar94;
      auVar92._8_4_ = fVar181 * fVar96;
      auVar92._12_4_ = fVar182 * fVar98;
      auVar102 = vsubps_avx(auVar92,auVar136);
      fVar84 = *(float *)(ray + k * 4 + 0x60);
      fVar94 = *(float *)(ray + k * 4 + 0x50);
      fVar96 = *(float *)(ray + k * 4 + 0x40);
      local_12e8._0_4_ = auVar90._0_4_ * fVar96 + fVar84 * auVar102._0_4_ + fVar94 * auVar89._0_4_;
      local_12e8._4_4_ = auVar90._4_4_ * fVar96 + fVar84 * auVar102._4_4_ + fVar94 * auVar89._4_4_;
      fStack_12e0 = auVar90._8_4_ * fVar96 + fVar84 * auVar102._8_4_ + fVar94 * auVar89._8_4_;
      fStack_12dc = auVar90._12_4_ * fVar96 + fVar84 * auVar102._12_4_ + fVar94 * auVar89._12_4_;
      local_1038 = vsubps_avx(auVar59,auVar71);
      local_1058 = vsubps_avx(auVar48,auVar72);
      fVar113 = fVar164 + auVar71._0_4_;
      fVar133 = fVar81 + auVar71._4_4_;
      fVar143 = fVar83 + auVar71._8_4_;
      fVar144 = fVar11 + auVar71._12_4_;
      fVar145 = fVar69 + auVar72._0_4_;
      fVar110 = fVar82 + auVar72._4_4_;
      fVar112 = fVar10 + auVar72._8_4_;
      fVar114 = fVar12 + auVar72._12_4_;
      fVar98 = local_1058._0_4_;
      auVar178._0_4_ = fVar113 * fVar98;
      fVar100 = local_1058._4_4_;
      auVar178._4_4_ = fVar133 * fVar100;
      fVar109 = local_1058._8_4_;
      auVar178._8_4_ = fVar143 * fVar109;
      fVar111 = local_1058._12_4_;
      auVar178._12_4_ = fVar144 * fVar111;
      fVar166 = local_1038._0_4_;
      auVar74._0_4_ = fVar166 * fVar145;
      fVar170 = local_1038._4_4_;
      auVar74._4_4_ = fVar170 * fVar110;
      fVar172 = local_1038._8_4_;
      auVar74._8_4_ = fVar172 * fVar112;
      fVar174 = local_1038._12_4_;
      auVar74._12_4_ = fVar174 * fVar114;
      auVar59 = vsubps_avx(auVar74,auVar178);
      local_1048 = vsubps_avx(auVar49,auVar70);
      fVar159 = local_1048._0_4_;
      auVar107._0_4_ = fVar159 * fVar145;
      fVar162 = local_1048._4_4_;
      auVar107._4_4_ = fVar162 * fVar110;
      fVar163 = local_1048._8_4_;
      auVar107._8_4_ = fVar163 * fVar112;
      fVar165 = local_1048._12_4_;
      auVar107._12_4_ = fVar165 * fVar114;
      fVar145 = fVar151 + auVar70._0_4_;
      fVar110 = fVar154 + auVar70._4_4_;
      fVar112 = fVar155 + auVar70._8_4_;
      fVar114 = fVar156 + auVar70._12_4_;
      auVar137._0_4_ = fVar145 * fVar98;
      auVar137._4_4_ = fVar110 * fVar100;
      auVar137._8_4_ = fVar112 * fVar109;
      auVar137._12_4_ = fVar114 * fVar111;
      auVar49 = vsubps_avx(auVar137,auVar107);
      auVar125._0_4_ = fVar166 * fVar145;
      auVar125._4_4_ = fVar170 * fVar110;
      auVar125._8_4_ = fVar172 * fVar112;
      auVar125._12_4_ = fVar174 * fVar114;
      auVar93._0_4_ = fVar159 * fVar113;
      auVar93._4_4_ = fVar162 * fVar133;
      auVar93._8_4_ = fVar163 * fVar143;
      auVar93._12_4_ = fVar165 * fVar144;
      auVar48 = vsubps_avx(auVar93,auVar125);
      auVar152._0_4_ = fVar96 * auVar59._0_4_ + fVar84 * auVar48._0_4_ + fVar94 * auVar49._0_4_;
      auVar152._4_4_ = fVar96 * auVar59._4_4_ + fVar84 * auVar48._4_4_ + fVar94 * auVar49._4_4_;
      auVar152._8_4_ = fVar96 * auVar59._8_4_ + fVar84 * auVar48._8_4_ + fVar94 * auVar49._8_4_;
      auVar152._12_4_ = fVar96 * auVar59._12_4_ + fVar84 * auVar48._12_4_ + fVar94 * auVar49._12_4_;
      auVar49 = vsubps_avx(auVar70,auVar86);
      fVar113 = auVar70._0_4_ + auVar86._0_4_;
      fVar133 = auVar70._4_4_ + auVar86._4_4_;
      fVar143 = auVar70._8_4_ + auVar86._8_4_;
      fVar144 = auVar70._12_4_ + auVar86._12_4_;
      auVar59 = vsubps_avx(auVar71,auVar87);
      fVar145 = auVar87._0_4_ + auVar71._0_4_;
      fVar110 = auVar87._4_4_ + auVar71._4_4_;
      fVar112 = auVar87._8_4_ + auVar71._8_4_;
      fVar114 = auVar87._12_4_ + auVar71._12_4_;
      auVar48 = vsubps_avx(auVar72,auVar88);
      fVar115 = auVar72._0_4_ + auVar88._0_4_;
      fVar121 = auVar72._4_4_ + auVar88._4_4_;
      fVar122 = auVar72._8_4_ + auVar88._8_4_;
      fVar123 = auVar72._12_4_ + auVar88._12_4_;
      fVar167 = auVar48._0_4_;
      auVar126._0_4_ = fVar167 * fVar145;
      fVar171 = auVar48._4_4_;
      auVar126._4_4_ = fVar171 * fVar110;
      fVar173 = auVar48._8_4_;
      auVar126._8_4_ = fVar173 * fVar112;
      fVar175 = auVar48._12_4_;
      auVar126._12_4_ = fVar175 * fVar114;
      fVar85 = auVar59._0_4_;
      auVar138._0_4_ = fVar85 * fVar115;
      fVar95 = auVar59._4_4_;
      auVar138._4_4_ = fVar95 * fVar121;
      fVar97 = auVar59._8_4_;
      auVar138._8_4_ = fVar97 * fVar122;
      fVar99 = auVar59._12_4_;
      auVar138._12_4_ = fVar99 * fVar123;
      auVar59 = vsubps_avx(auVar138,auVar126);
      fVar101 = auVar49._0_4_;
      auVar117._0_4_ = fVar101 * fVar115;
      fVar115 = auVar49._4_4_;
      auVar117._4_4_ = fVar115 * fVar121;
      fVar121 = auVar49._8_4_;
      auVar117._8_4_ = fVar121 * fVar122;
      fVar122 = auVar49._12_4_;
      auVar117._12_4_ = fVar122 * fVar123;
      auVar139._0_4_ = fVar167 * fVar113;
      auVar139._4_4_ = fVar171 * fVar133;
      auVar139._8_4_ = fVar173 * fVar143;
      auVar139._12_4_ = fVar175 * fVar144;
      auVar49 = vsubps_avx(auVar139,auVar117);
      auVar62._0_4_ = fVar113 * fVar85;
      auVar62._4_4_ = fVar133 * fVar95;
      auVar62._8_4_ = fVar143 * fVar97;
      auVar62._12_4_ = fVar144 * fVar99;
      auVar75._0_4_ = fVar101 * fVar145;
      auVar75._4_4_ = fVar115 * fVar110;
      auVar75._8_4_ = fVar121 * fVar112;
      auVar75._12_4_ = fVar122 * fVar114;
      auVar48 = vsubps_avx(auVar75,auVar62);
      auVar63._0_4_ = fVar96 * auVar59._0_4_ + fVar84 * auVar48._0_4_ + fVar94 * auVar49._0_4_;
      auVar63._4_4_ = fVar96 * auVar59._4_4_ + fVar84 * auVar48._4_4_ + fVar94 * auVar49._4_4_;
      auVar63._8_4_ = fVar96 * auVar59._8_4_ + fVar84 * auVar48._8_4_ + fVar94 * auVar49._8_4_;
      auVar63._12_4_ = fVar96 * auVar59._12_4_ + fVar84 * auVar48._12_4_ + fVar94 * auVar49._12_4_;
      auVar157._0_4_ = auVar63._0_4_ + auVar152._0_4_ + (float)local_12e8._0_4_;
      auVar157._4_4_ = auVar63._4_4_ + auVar152._4_4_ + (float)local_12e8._4_4_;
      auVar157._8_4_ = auVar63._8_4_ + auVar152._8_4_ + fStack_12e0;
      auVar157._12_4_ = auVar63._12_4_ + auVar152._12_4_ + fStack_12dc;
      auVar49 = vminps_avx((undefined1  [16])_local_12e8,auVar152);
      auVar49 = vminps_avx(auVar49,auVar63);
      auVar118._8_4_ = 0x7fffffff;
      auVar118._0_8_ = 0x7fffffff7fffffff;
      auVar118._12_4_ = 0x7fffffff;
      local_1068 = vandps_avx(auVar157,auVar118);
      auVar119._0_4_ = local_1068._0_4_ * 1.1920929e-07;
      auVar119._4_4_ = local_1068._4_4_ * 1.1920929e-07;
      auVar119._8_4_ = local_1068._8_4_ * 1.1920929e-07;
      auVar119._12_4_ = local_1068._12_4_ * 1.1920929e-07;
      uVar38 = CONCAT44(auVar119._4_4_,auVar119._0_4_);
      auVar127._0_8_ = uVar38 ^ 0x8000000080000000;
      auVar127._8_4_ = -auVar119._8_4_;
      auVar127._12_4_ = -auVar119._12_4_;
      auVar49 = vcmpps_avx(auVar49,auVar127,5);
      auVar59 = vmaxps_avx((undefined1  [16])_local_12e8,auVar152);
      auVar59 = vmaxps_avx(auVar59,auVar63);
      auVar59 = vcmpps_avx(auVar59,auVar119,2);
      auVar49 = vorps_avx(auVar49,auVar59);
      if ((((auVar49 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar49 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar49 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar49[0xf] < '\0'
         ) {
        auVar64._0_4_ = fVar58 * fVar166;
        auVar64._4_4_ = fVar68 * fVar170;
        auVar64._8_4_ = fVar16 * fVar172;
        auVar64._12_4_ = fVar17 * fVar174;
        auVar76._0_4_ = fVar183 * fVar98;
        auVar76._4_4_ = fVar186 * fVar100;
        auVar76._8_4_ = fVar187 * fVar109;
        auVar76._12_4_ = fVar188 * fVar111;
        auVar70 = vsubps_avx(auVar76,auVar64);
        auVar120._0_4_ = fVar98 * fVar85;
        auVar120._4_4_ = fVar100 * fVar95;
        auVar120._8_4_ = fVar109 * fVar97;
        auVar120._12_4_ = fVar111 * fVar99;
        auVar128._0_4_ = fVar167 * fVar166;
        auVar128._4_4_ = fVar171 * fVar170;
        auVar128._8_4_ = fVar173 * fVar172;
        auVar128._12_4_ = fVar175 * fVar174;
        auVar71 = vsubps_avx(auVar128,auVar120);
        auVar140._8_4_ = 0x7fffffff;
        auVar140._0_8_ = 0x7fffffff7fffffff;
        auVar140._12_4_ = 0x7fffffff;
        auVar59 = vandps_avx(auVar140,auVar64);
        auVar48 = vandps_avx(auVar140,auVar120);
        auVar59 = vcmpps_avx(auVar59,auVar48,1);
        local_1128 = vblendvps_avx(auVar71,auVar70,auVar59);
        auVar52._0_4_ = fVar159 * fVar167;
        auVar52._4_4_ = fVar162 * fVar171;
        auVar52._8_4_ = fVar163 * fVar173;
        auVar52._12_4_ = fVar165 * fVar175;
        auVar65._0_4_ = fVar159 * fVar58;
        auVar65._4_4_ = fVar162 * fVar68;
        auVar65._8_4_ = fVar163 * fVar16;
        auVar65._12_4_ = fVar165 * fVar17;
        auVar77._0_4_ = fVar176 * fVar98;
        auVar77._4_4_ = fVar180 * fVar100;
        auVar77._8_4_ = fVar181 * fVar109;
        auVar77._12_4_ = fVar182 * fVar111;
        auVar70 = vsubps_avx(auVar65,auVar77);
        auVar129._0_4_ = fVar98 * fVar101;
        auVar129._4_4_ = fVar100 * fVar115;
        auVar129._8_4_ = fVar109 * fVar121;
        auVar129._12_4_ = fVar111 * fVar122;
        auVar71 = vsubps_avx(auVar129,auVar52);
        auVar59 = vandps_avx(auVar140,auVar77);
        auVar48 = vandps_avx(auVar140,auVar52);
        auVar59 = vcmpps_avx(auVar59,auVar48,1);
        local_1118 = vblendvps_avx(auVar71,auVar70,auVar59);
        auVar66._0_4_ = fVar101 * fVar166;
        auVar66._4_4_ = fVar115 * fVar170;
        auVar66._8_4_ = fVar121 * fVar172;
        auVar66._12_4_ = fVar122 * fVar174;
        auVar78._0_4_ = fVar176 * fVar166;
        auVar78._4_4_ = fVar180 * fVar170;
        auVar78._8_4_ = fVar181 * fVar172;
        auVar78._12_4_ = fVar182 * fVar174;
        auVar108._0_4_ = fVar159 * fVar183;
        auVar108._4_4_ = fVar162 * fVar186;
        auVar108._8_4_ = fVar163 * fVar187;
        auVar108._12_4_ = fVar165 * fVar188;
        auVar42._0_4_ = fVar159 * fVar85;
        auVar42._4_4_ = fVar162 * fVar95;
        auVar42._8_4_ = fVar163 * fVar97;
        auVar42._12_4_ = fVar165 * fVar99;
        auVar70 = vsubps_avx(auVar78,auVar108);
        auVar71 = vsubps_avx(auVar42,auVar66);
        auVar59 = vandps_avx(auVar140,auVar108);
        auVar48 = vandps_avx(auVar140,auVar66);
        auVar59 = vcmpps_avx(auVar59,auVar48,1);
        local_1108 = vblendvps_avx(auVar71,auVar70,auVar59);
        fVar58 = local_1128._0_4_ * fVar96 + local_1108._0_4_ * fVar84 + local_1118._0_4_ * fVar94;
        fVar98 = local_1128._4_4_ * fVar96 + local_1108._4_4_ * fVar84 + local_1118._4_4_ * fVar94;
        fVar68 = local_1128._8_4_ * fVar96 + local_1108._8_4_ * fVar84 + local_1118._8_4_ * fVar94;
        fVar84 = local_1128._12_4_ * fVar96 +
                 local_1108._12_4_ * fVar84 + local_1118._12_4_ * fVar94;
        auVar67._0_4_ = fVar58 + fVar58;
        auVar67._4_4_ = fVar98 + fVar98;
        auVar67._8_4_ = fVar68 + fVar68;
        auVar67._12_4_ = fVar84 + fVar84;
        fVar69 = local_1128._0_4_ * fVar151 + local_1108._0_4_ * fVar69 + local_1118._0_4_ * fVar164
        ;
        fVar81 = local_1128._4_4_ * fVar154 + local_1108._4_4_ * fVar82 + local_1118._4_4_ * fVar81;
        fVar82 = local_1128._8_4_ * fVar155 + local_1108._8_4_ * fVar10 + local_1118._8_4_ * fVar83;
        fVar83 = local_1128._12_4_ * fVar156 +
                 local_1108._12_4_ * fVar12 + local_1118._12_4_ * fVar11;
        auVar59 = vrcpps_avx(auVar67);
        fVar84 = auVar59._0_4_;
        auVar130._0_4_ = auVar67._0_4_ * fVar84;
        fVar94 = auVar59._4_4_;
        auVar130._4_4_ = auVar67._4_4_ * fVar94;
        fVar96 = auVar59._8_4_;
        auVar130._8_4_ = auVar67._8_4_ * fVar96;
        fVar164 = auVar59._12_4_;
        auVar130._12_4_ = auVar67._12_4_ * fVar164;
        auVar141._8_4_ = 0x3f800000;
        auVar141._0_8_ = 0x3f8000003f800000;
        auVar141._12_4_ = 0x3f800000;
        auVar59 = vsubps_avx(auVar141,auVar130);
        auVar131._0_4_ = fVar84 * auVar59._0_4_;
        auVar131._4_4_ = fVar94 * auVar59._4_4_;
        auVar131._8_4_ = fVar96 * auVar59._8_4_;
        auVar131._12_4_ = fVar164 * auVar59._12_4_;
        local_1138._0_4_ = (fVar69 + fVar69) * (fVar84 + auVar131._0_4_);
        local_1138._4_4_ = (fVar81 + fVar81) * (fVar94 + auVar131._4_4_);
        local_1138._8_4_ = (fVar82 + fVar82) * (fVar96 + auVar131._8_4_);
        local_1138._12_4_ = (fVar83 + fVar83) * (fVar164 + auVar131._12_4_);
        auVar47 = ZEXT1664(local_1138);
        uVar19 = *(undefined4 *)(ray + k * 4 + 0x30);
        auVar79._4_4_ = uVar19;
        auVar79._0_4_ = uVar19;
        auVar79._8_4_ = uVar19;
        auVar79._12_4_ = uVar19;
        auVar59 = vcmpps_avx(auVar79,local_1138,2);
        uVar19 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar149._4_4_ = uVar19;
        auVar149._0_4_ = uVar19;
        auVar149._8_4_ = uVar19;
        auVar149._12_4_ = uVar19;
        auVar132 = ZEXT1664(auVar149);
        auVar48 = vcmpps_avx(local_1138,auVar149,2);
        auVar59 = vandps_avx(auVar48,auVar59);
        auVar48 = auVar49 & auVar59;
        if ((((auVar48 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar48 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar48 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar48[0xf] < '\0') {
          auVar49 = vandps_avx(auVar49,auVar59);
          auVar59 = vcmpps_avx(auVar67,_DAT_01f45a50,4);
          auVar48 = auVar59 & auVar49;
          if ((((auVar48 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar48 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar48 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar48[0xf] < '\0') {
            valid.field_0 =
                 (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)vandps_avx(auVar49,auVar59);
            tNear.field_0 = _local_12e8;
            auVar49 = vrcpps_avx(auVar157);
            fVar84 = auVar49._0_4_;
            auVar53._0_4_ = auVar157._0_4_ * fVar84;
            fVar94 = auVar49._4_4_;
            auVar53._4_4_ = auVar157._4_4_ * fVar94;
            fVar96 = auVar49._8_4_;
            auVar53._8_4_ = auVar157._8_4_ * fVar96;
            fVar164 = auVar49._12_4_;
            auVar53._12_4_ = auVar157._12_4_ * fVar164;
            auVar80._8_4_ = 0x3f800000;
            auVar80._0_8_ = 0x3f8000003f800000;
            auVar80._12_4_ = 0x3f800000;
            auVar49 = vsubps_avx(auVar80,auVar53);
            auVar43._0_4_ = fVar84 + fVar84 * auVar49._0_4_;
            auVar43._4_4_ = fVar94 + fVar94 * auVar49._4_4_;
            auVar43._8_4_ = fVar96 + fVar96 * auVar49._8_4_;
            auVar43._12_4_ = fVar164 + fVar164 * auVar49._12_4_;
            auVar54._8_4_ = 0x219392ef;
            auVar54._0_8_ = 0x219392ef219392ef;
            auVar54._12_4_ = 0x219392ef;
            auVar49 = vcmpps_avx(local_1068,auVar54,5);
            auVar49 = vandps_avx(auVar49,auVar43);
            auVar55._0_4_ = (float)local_12e8._0_4_ * auVar49._0_4_;
            auVar55._4_4_ = (float)local_12e8._4_4_ * auVar49._4_4_;
            auVar55._8_4_ = fStack_12e0 * auVar49._8_4_;
            auVar55._12_4_ = fStack_12dc * auVar49._12_4_;
            local_1158 = vminps_avx(auVar55,auVar80);
            auVar44._0_4_ = auVar152._0_4_ * auVar49._0_4_;
            auVar44._4_4_ = auVar152._4_4_ * auVar49._4_4_;
            auVar44._8_4_ = auVar152._8_4_ * auVar49._8_4_;
            auVar44._12_4_ = auVar152._12_4_ * auVar49._12_4_;
            local_1148 = vminps_avx(auVar44,auVar80);
            auVar56._8_4_ = 0x7f800000;
            auVar56._0_8_ = 0x7f8000007f800000;
            auVar56._12_4_ = 0x7f800000;
            auVar49 = vblendvps_avx(auVar56,local_1138,(undefined1  [16])valid.field_0);
            auVar59 = vshufps_avx(auVar49,auVar49,0xb1);
            auVar59 = vminps_avx(auVar59,auVar49);
            auVar48 = vshufpd_avx(auVar59,auVar59,1);
            auVar59 = vminps_avx(auVar48,auVar59);
            auVar49 = vcmpps_avx(auVar49,auVar59,0);
            auVar48 = (undefined1  [16])valid.field_0 & auVar49;
            auVar59 = vpcmpeqd_avx(auVar59,auVar59);
            if ((((auVar48 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar48 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar48 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar48[0xf] < '\0') {
              auVar59 = auVar49;
            }
            auVar49 = vandps_avx((undefined1  [16])valid.field_0,auVar59);
            uVar19 = vmovmskps_avx(auVar49);
            uVar38 = CONCAT44((int)((ulong)&mapUV >> 0x20),uVar19);
            lVar27 = 0;
            if (uVar38 != 0) {
              for (; (uVar38 >> lVar27 & 1) == 0; lVar27 = lVar27 + 1) {
              }
            }
            auVar49 = vpcmpeqd_avx(auVar131,auVar131);
            auVar142 = ZEXT1664(auVar49);
LAB_00eef4d1:
            uVar22 = *(uint *)((long)&local_1018 + lVar27 * 4);
            pRVar21 = (RTCRayN *)(ulong)uVar22;
            pGVar9 = (pSVar8->geometries).items[(long)pRVar21].ptr;
            if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
              valid.field_0.v[lVar27] = 0.0;
            }
            else {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                uVar19 = *(undefined4 *)(local_1158 + lVar27 * 4);
                uVar5 = *(undefined4 *)(local_1148 + lVar27 * 4);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1138 + lVar27 * 4);
                *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_1128 + lVar27 * 4);
                *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_1118 + lVar27 * 4);
                *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_1108 + lVar27 * 4);
                *(undefined4 *)(ray + k * 4 + 0xf0) = uVar19;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar5;
                *(undefined4 *)(ray + k * 4 + 0x110) =
                     *(undefined4 *)((long)&local_11b8 + lVar27 * 4);
                *(uint *)(ray + k * 4 + 0x120) = uVar22;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                goto LAB_00eef8fe;
              }
              uVar19 = *(undefined4 *)(local_1158 + lVar27 * 4);
              local_fd8._4_4_ = uVar19;
              local_fd8._0_4_ = uVar19;
              local_fd8._8_4_ = uVar19;
              local_fd8._12_4_ = uVar19;
              local_fc8 = *(undefined4 *)(local_1148 + lVar27 * 4);
              local_fa8 = vpshufd_avx(ZEXT416(uVar22),0);
              uVar19 = *(undefined4 *)((long)&local_11b8 + lVar27 * 4);
              local_fb8._4_4_ = uVar19;
              local_fb8._0_4_ = uVar19;
              local_fb8._8_4_ = uVar19;
              local_fb8._12_4_ = uVar19;
              uVar19 = *(undefined4 *)(local_1128 + lVar27 * 4);
              uVar5 = *(undefined4 *)(local_1118 + lVar27 * 4);
              local_ff8._4_4_ = uVar5;
              local_ff8._0_4_ = uVar5;
              local_ff8._8_4_ = uVar5;
              local_ff8._12_4_ = uVar5;
              uVar5 = *(undefined4 *)(local_1108 + lVar27 * 4);
              local_fe8._4_4_ = uVar5;
              local_fe8._0_4_ = uVar5;
              local_fe8._8_4_ = uVar5;
              local_fe8._12_4_ = uVar5;
              local_1008[0] = (RTCHitN)(char)uVar19;
              local_1008[1] = (RTCHitN)(char)((uint)uVar19 >> 8);
              local_1008[2] = (RTCHitN)(char)((uint)uVar19 >> 0x10);
              local_1008[3] = (RTCHitN)(char)((uint)uVar19 >> 0x18);
              local_1008[4] = (RTCHitN)(char)uVar19;
              local_1008[5] = (RTCHitN)(char)((uint)uVar19 >> 8);
              local_1008[6] = (RTCHitN)(char)((uint)uVar19 >> 0x10);
              local_1008[7] = (RTCHitN)(char)((uint)uVar19 >> 0x18);
              local_1008[8] = (RTCHitN)(char)uVar19;
              local_1008[9] = (RTCHitN)(char)((uint)uVar19 >> 8);
              local_1008[10] = (RTCHitN)(char)((uint)uVar19 >> 0x10);
              local_1008[0xb] = (RTCHitN)(char)((uint)uVar19 >> 0x18);
              local_1008[0xc] = (RTCHitN)(char)uVar19;
              local_1008[0xd] = (RTCHitN)(char)((uint)uVar19 >> 8);
              local_1008[0xe] = (RTCHitN)(char)((uint)uVar19 >> 0x10);
              local_1008[0xf] = (RTCHitN)(char)((uint)uVar19 >> 0x18);
              uStack_fc4 = local_fc8;
              uStack_fc0 = local_fc8;
              uStack_fbc = local_fc8;
              vcmpps_avx(ZEXT1632(local_fd8),ZEXT1632(local_fd8),0xf);
              uStack_f94 = context->user->instID[0];
              local_f98 = uStack_f94;
              uStack_f90 = uStack_f94;
              uStack_f8c = uStack_f94;
              uStack_f88 = context->user->instPrimID[0];
              uStack_f84 = uStack_f88;
              uStack_f80 = uStack_f88;
              uStack_f7c = uStack_f88;
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1138 + lVar27 * 4);
              local_1228 = *local_1218;
              args.valid = (int *)local_1228;
              args.geometryUserPtr = pGVar9->userPtr;
              args.context = context->user;
              args.hit = local_1008;
              args.N = 4;
              pRVar21 = (RTCRayN *)pGVar9->intersectionFilterN;
              auVar49 = auVar47._0_16_;
              auVar59 = auVar132._0_16_;
              args.ray = (RTCRayN *)ray;
              if (pRVar21 != (RTCRayN *)0x0) {
                auVar48 = auVar142._0_16_;
                pRVar21 = (RTCRayN *)(*(code *)pRVar21)(&args);
                auVar132 = ZEXT1664(auVar59);
                auVar47 = ZEXT1664(auVar49);
                auVar48 = vpcmpeqd_avx(auVar48,auVar48);
                auVar142 = ZEXT1664(auVar48);
              }
              auVar48 = auVar142._0_16_;
              if (local_1228 == (undefined1  [16])0x0) {
                auVar49 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                auVar49 = auVar49 ^ auVar48;
              }
              else {
                pRVar21 = (RTCRayN *)context->args->filter;
                if ((pRVar21 != (RTCRayN *)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar9->field_8).field_0x2 & 0x40) != 0))))
                {
                  pRVar21 = (RTCRayN *)(*(code *)pRVar21)(&args);
                  auVar132 = ZEXT1664(auVar59);
                  auVar47 = ZEXT1664(auVar49);
                  auVar49 = vpcmpeqd_avx(auVar48,auVar48);
                  auVar142 = ZEXT1664(auVar49);
                }
                auVar59 = vpcmpeqd_avx(local_1228,_DAT_01f45a50);
                auVar49 = auVar59 ^ auVar142._0_16_;
                if (local_1228 != (undefined1  [16])0x0) {
                  auVar59 = auVar59 ^ auVar142._0_16_;
                  auVar48 = vmaskmovps_avx(auVar59,*(undefined1 (*) [16])args.hit);
                  *(undefined1 (*) [16])(args.ray + 0xc0) = auVar48;
                  auVar48 = vmaskmovps_avx(auVar59,*(undefined1 (*) [16])(args.hit + 0x10));
                  *(undefined1 (*) [16])(args.ray + 0xd0) = auVar48;
                  auVar48 = vmaskmovps_avx(auVar59,*(undefined1 (*) [16])(args.hit + 0x20));
                  *(undefined1 (*) [16])(args.ray + 0xe0) = auVar48;
                  auVar48 = vmaskmovps_avx(auVar59,*(undefined1 (*) [16])(args.hit + 0x30));
                  *(undefined1 (*) [16])(args.ray + 0xf0) = auVar48;
                  auVar48 = vmaskmovps_avx(auVar59,*(undefined1 (*) [16])(args.hit + 0x40));
                  *(undefined1 (*) [16])(args.ray + 0x100) = auVar48;
                  auVar48 = vmaskmovps_avx(auVar59,*(undefined1 (*) [16])(args.hit + 0x50));
                  *(undefined1 (*) [16])(args.ray + 0x110) = auVar48;
                  auVar48 = vmaskmovps_avx(auVar59,*(undefined1 (*) [16])(args.hit + 0x60));
                  *(undefined1 (*) [16])(args.ray + 0x120) = auVar48;
                  auVar48 = vmaskmovps_avx(auVar59,*(undefined1 (*) [16])(args.hit + 0x70));
                  *(undefined1 (*) [16])(args.ray + 0x130) = auVar48;
                  auVar59 = vmaskmovps_avx(auVar59,*(undefined1 (*) [16])(args.hit + 0x80));
                  *(undefined1 (*) [16])(args.ray + 0x140) = auVar59;
                  pRVar21 = args.ray;
                }
              }
              auVar46._8_8_ = 0x100000001;
              auVar46._0_8_ = 0x100000001;
              if ((auVar46 & auVar49) == (undefined1  [16])0x0) {
                *(int *)(ray + k * 4 + 0x80) = auVar132._0_4_;
              }
              else {
                auVar132 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
              }
              valid.field_0.v[lVar27] = 0.0;
              auVar49 = vshufps_avx(auVar132._0_16_,auVar132._0_16_,0);
              auVar49 = vcmpps_avx(auVar47._0_16_,auVar49,2);
              valid.field_0 =
                   (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                   vandps_avx(auVar49,(undefined1  [16])valid.field_0);
            }
            if (((((undefined1  [16])valid.field_0 >> 0x1f & (undefined1  [16])0x1) ==
                  (undefined1  [16])0x0 &&
                 ((undefined1  [16])valid.field_0 >> 0x3f & (undefined1  [16])0x1) ==
                 (undefined1  [16])0x0) &&
                ((undefined1  [16])valid.field_0 >> 0x5f & (undefined1  [16])0x1) ==
                (undefined1  [16])0x0) && -1 < valid.field_0._15_1_) goto LAB_00eef8fe;
            auVar57._8_4_ = 0x7f800000;
            auVar57._0_8_ = 0x7f8000007f800000;
            auVar57._12_4_ = 0x7f800000;
            auVar49 = vblendvps_avx(auVar57,auVar47._0_16_,(undefined1  [16])valid.field_0);
            auVar59 = vshufps_avx(auVar49,auVar49,0xb1);
            auVar59 = vminps_avx(auVar59,auVar49);
            auVar48 = vshufpd_avx(auVar59,auVar59,1);
            auVar59 = vminps_avx(auVar48,auVar59);
            auVar49 = vcmpps_avx(auVar49,auVar59,0);
            auVar59 = (undefined1  [16])valid.field_0 & auVar49;
            aVar45 = valid.field_0;
            if ((((auVar59 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar59 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar59 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar59[0xf] < '\0') {
              aVar45.v = (__m128)vandps_avx(auVar49,valid.field_0);
            }
            uVar19 = vmovmskps_avx((undefined1  [16])aVar45);
            uVar38 = CONCAT44((int)((ulong)pRVar21 >> 0x20),uVar19);
            lVar27 = 0;
            if (uVar38 != 0) {
              for (; (uVar38 >> lVar27 & 1) == 0; lVar27 = lVar27 + 1) {
              }
            }
            goto LAB_00eef4d1;
          }
        }
      }
LAB_00eef8fe:
      auVar132 = ZEXT1664(local_1078);
      auVar142 = ZEXT1664(local_1088);
      auVar150 = ZEXT1664(local_1098);
      auVar153 = ZEXT1664(local_10a8);
      auVar158 = ZEXT1664(local_10b8);
      auVar161 = ZEXT1664(local_10c8);
      auVar169 = ZEXT1664(local_10d8);
      auVar179 = ZEXT1664(local_10e8);
      auVar185 = ZEXT1664(local_10f8);
      uVar38 = local_1210;
    }
    uVar19 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar47 = ZEXT1664(CONCAT412(uVar19,CONCAT48(uVar19,CONCAT44(uVar19,uVar19))));
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }